

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallGenerator::CreateComponentTest_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallGenerator *this,char *component,
          bool exclude_from_all)

{
  allocator local_23;
  undefined1 local_22;
  byte local_21;
  char *pcStack_20;
  bool exclude_from_all_local;
  char *component_local;
  cmInstallGenerator *this_local;
  string *result;
  
  local_22 = 0;
  local_21 = exclude_from_all;
  pcStack_20 = component;
  component_local = (char *)this;
  this_local = (cmInstallGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"\"${CMAKE_INSTALL_COMPONENT}\" STREQUAL \"",&local_23
            );
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcStack_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__," OR NOT CMAKE_INSTALL_COMPONENT");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::CreateComponentTest(const char* component,
                                                    bool exclude_from_all)
{
  std::string result = "\"${CMAKE_INSTALL_COMPONENT}\" STREQUAL \"";
  result += component;
  result += "\"";
  if (!exclude_from_all) {
    result += " OR NOT CMAKE_INSTALL_COMPONENT";
  }
  return result;
}